

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportModuleVariables(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  uint uniqueId;
  ByteCode *code;
  InplaceStr name_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ExternVarInfo *pEVar4;
  SynIdentifier *this;
  VariableData *this_00;
  bool local_ed;
  VariableData *local_d0;
  VariableData *data;
  char *pcStack_c0;
  SynIdentifier *local_b0;
  SynIdentifier *nameIdentifier;
  TypeBase *type;
  InplaceStr local_90;
  undefined1 auStack_80 [8];
  InplaceStr name;
  ExternVarInfo *variable;
  uint i;
  ExternVarInfo *variableList;
  char *symbols;
  ByteCode *bCode;
  TraceScope traceScope;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)
                                   ::token), iVar1 != 0)) {
    ImportModuleVariables::token = NULLC::TraceGetToken("analyze","ImportModuleVariables");
    __cxa_guard_release(&ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bCode,ImportModuleVariables::token);
  code = moduleCtx->data->bytecode;
  pcVar3 = FindSymbols(code);
  pEVar4 = FindFirstVar(code);
  for (variable._4_4_ = 0; variable._4_4_ < code->variableExportCount;
      variable._4_4_ = variable._4_4_ + 1) {
    name.end = (char *)(pEVar4 + variable._4_4_);
    InplaceStr::InplaceStr
              ((InplaceStr *)auStack_80,pcVar3 + ((ExternVarInfo *)name.end)->offsetToName);
    uVar2 = InplaceStr::length((InplaceStr *)auStack_80);
    local_ed = false;
    if (4 < uVar2) {
      InplaceStr::InplaceStr
                (&local_90,(char *)auStack_80,(char *)((long)(SynBase **)auStack_80 + 5));
      InplaceStr::InplaceStr((InplaceStr *)&type,"$temp");
      local_ed = InplaceStr::operator==(&local_90,(InplaceStr *)&type);
    }
    if (local_ed == false) {
      nameIdentifier =
           (SynIdentifier *)GetImportedModuleTypeAt(ctx,source,moduleCtx,*(uint *)(name.end + 8));
      if ((TypeBase *)nameIdentifier == (TypeBase *)0x0) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,source,"ERROR: can\'t find variable \'%s\' type in module %.*s",
                   pcVar3 + *(uint *)name.end,
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                (int)(moduleCtx->data->name).begin));
      }
      this = ExpressionContext::get<SynIdentifier>(ctx);
      data = (VariableData *)auStack_80;
      pcStack_c0 = name.begin;
      name_00.end = name.begin;
      name_00.begin = (char *)auStack_80;
      SynIdentifier::SynIdentifier(this,name_00);
      local_b0 = this;
      this_00 = ExpressionContext::get<VariableData>(ctx);
      uVar2 = *(uint *)(name.end + 0xc);
      uniqueId = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uniqueId + 1;
      VariableData::VariableData
                (this_00,ctx->allocator,source,ctx->scope,0,(TypeBase *)nameIdentifier,local_b0,
                 uVar2,uniqueId);
      this_00->importModule = moduleCtx->data;
      local_d0 = this_00;
      ExpressionContext::AddVariable(ctx,this_00,true);
      uVar2 = InplaceStr::length((InplaceStr *)auStack_80);
      if ((5 < uVar2) && (iVar1 = memcmp((void *)auStack_80,"$vtbl",5), iVar1 == 0)) {
        SmallArray<VariableData_*,_128U>::push_back(&ctx->vtables,&local_d0);
        SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
                  (&ctx->vtableMap,(InplaceStr *)auStack_80,&local_d0);
      }
    }
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&bCode);
  return;
}

Assistant:

void ImportModuleVariables(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleVariables");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import variables
	ExternVarInfo *variableList = FindFirstVar(bCode);

	for(unsigned i = 0; i < bCode->variableExportCount; i++)
	{
		ExternVarInfo &variable = variableList[i];

		InplaceStr name = InplaceStr(symbols + variable.offsetToName);

		// Exclude temporary variables from import
		if(name.length() >= 5 && InplaceStr(name.begin, name.begin + 5) == InplaceStr("$temp"))
			continue;

		TypeBase *type = GetImportedModuleTypeAt(ctx, source, moduleCtx, variable.type);

		if(!type)
			Stop(ctx, source, "ERROR: can't find variable '%s' type in module %.*s", symbols + variable.offsetToName, FMT_ISTR(moduleCtx.data->name));

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

		VariableData *data = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, nameIdentifier, variable.offset, ctx.uniqueVariableId++);

		data->importModule = moduleCtx.data;

		ctx.AddVariable(data, true);

		if(name.length() > 5 && memcmp(name.begin, "$vtbl", 5) == 0)
		{
			ctx.vtables.push_back(data);
			ctx.vtableMap.insert(name, data);
		}
	}
}